

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_mem.c
# Opt level: O2

TRef fwd_ahload(jit_State *J,IRRef xref)

{
  char cVar1;
  ushort uVar2;
  ushort uVar3;
  IRIns *pIVar4;
  AliasRet AVar5;
  uint uVar6;
  TRef TVar7;
  ulong uVar8;
  IRRef1 *pIVar9;
  cTValue *pcVar10;
  uint uVar11;
  IRIns *pIVar12;
  IRIns *pIVar13;
  uint uVar14;
  ulong uVar15;
  TValue keyv;
  
  pIVar4 = (J->cur).ir;
  pIVar13 = pIVar4 + xref;
  uVar8 = (ulong)(J->fold).ins.field_1.o;
  pIVar9 = J->chain + uVar8 + 7;
  while( true ) {
    uVar14 = (uint)*pIVar9;
    uVar6 = (uint)*pIVar9;
    if (uVar6 <= xref) break;
    AVar5 = aa_ahref(J,pIVar13,pIVar4 + pIVar4[uVar6].field_0.op1);
    uVar11 = uVar14;
    if (AVar5 == ALIAS_MAY) goto LAB_0012554d;
    if (AVar5 == ALIAS_MUST) {
      return (uint)(&pIVar4->field_0)[uVar6].op2;
    }
    pIVar9 = &(&pIVar4->field_0)[uVar6].prev;
  }
  pIVar12 = pIVar13;
  if (((pIVar13->field_1).o & 0xfe) == 0x38) {
    pIVar12 = pIVar4 + (pIVar13->field_0).op1;
  }
  uVar3 = (pIVar12->field_0).op1;
  cVar1 = *(char *)((long)pIVar4 + (ulong)uVar3 * 8 + 5);
  uVar11 = xref;
  if ((cVar1 == 'N') || ((cVar1 == 'O' && (-1 < (short)(pIVar13->field_0).op2)))) {
    if ((pIVar13->field_1).o != 0x38) {
LAB_0012551c:
      do {
        if (uVar14 <= uVar3) goto LAB_0012558c;
        uVar15 = (ulong)uVar14;
        AVar5 = aa_ahref(J,pIVar13,pIVar4 + pIVar4[uVar15].field_0.op1);
        if (AVar5 == ALIAS_MAY) goto LAB_0012554d;
        if (AVar5 == ALIAS_MUST) {
          return (uint)*(ushort *)((long)pIVar4 + uVar15 * 8 + 2);
        }
        uVar14 = (uint)*(ushort *)((long)pIVar4 + uVar15 * 8 + 6);
      } while( true );
    }
    pIVar9 = J->chain + 0x3b;
    do {
      uVar2 = *pIVar9;
      if (uVar2 <= uVar3) goto LAB_0012551c;
      pIVar9 = &(&pIVar4->field_0)[uVar2].prev;
    } while ((*(byte *)((long)pIVar4 + (ulong)(&pIVar4->field_0)[uVar2].op2 * 8 + 4) & 0x1f) != 0xe)
    ;
  }
LAB_0012554d:
  pIVar9 = J->chain + uVar8;
  do {
    uVar3 = *pIVar9;
    if (uVar3 <= uVar11) {
      return 0;
    }
    pIVar9 = &pIVar4[uVar3].field_0.prev;
  } while (pIVar4[uVar3].field_0.op1 != xref);
  return (uint)uVar3;
LAB_0012558c:
  uVar6 = (J->fold).ins.field_1.t.irt & 0x1f;
  if ((byte)uVar6 < 3) {
    return uVar6 * 0x1000001 ^ 0x7fff;
  }
  if (((byte)uVar6 == 0xe) || (uVar6 == 4)) {
    pIVar13 = pIVar4 + (pIVar13->field_0).op2;
    if ((pIVar13->field_1).o == '\x1d') {
      pIVar13 = pIVar4 + (pIVar13->field_0).op1;
    }
    lj_ir_kvalue(J->L,&keyv,pIVar13);
    pcVar10 = lj_tab_get(J->L,(GCtab *)(ulong)(J->cur).ir[pIVar4[uVar3].field_0.op1].field_1.op12,
                         &keyv);
    if (((J->fold).ins.field_1.t.irt & 0x1f) == 0xe) {
      TVar7 = lj_ir_knum_u64(J,pcVar10->u64);
      return TVar7;
    }
    TVar7 = lj_ir_kgc(J,(GCobj *)(ulong)(pcVar10->u32).lo,IRT_STR);
    return TVar7;
  }
  goto LAB_0012554d;
}

Assistant:

static TRef fwd_ahload(jit_State *J, IRRef xref)
{
  IRIns *xr = IR(xref);
  IRRef lim = xref;  /* Search limit. */
  IRRef ref;

  /* Search for conflicting stores. */
  ref = J->chain[fins->o+IRDELTA_L2S];
  while (ref > xref) {
    IRIns *store = IR(ref);
    switch (aa_ahref(J, xr, IR(store->op1))) {
    case ALIAS_NO:   break;  /* Continue searching. */
    case ALIAS_MAY:  lim = ref; goto cselim;  /* Limit search for load. */
    case ALIAS_MUST: return store->op2;  /* Store forwarding. */
    }
    ref = store->prev;
  }

  /* No conflicting store (yet): const-fold loads from allocations. */
  {
    IRIns *ir = (xr->o == IR_HREFK || xr->o == IR_AREF) ? IR(xr->op1) : xr;
    IRRef tab = ir->op1;
    ir = IR(tab);
    if (ir->o == IR_TNEW || (ir->o == IR_TDUP && irref_isk(xr->op2))) {
      /* A NEWREF with a number key may end up pointing to the array part.
      ** But it's referenced from HSTORE and not found in the ASTORE chain.
      ** For now simply consider this a conflict without forwarding anything.
      */
      if (xr->o == IR_AREF) {
	IRRef ref2 = J->chain[IR_NEWREF];
	while (ref2 > tab) {
	  IRIns *newref = IR(ref2);
	  if (irt_isnum(IR(newref->op2)->t))
	    goto cselim;
	  ref2 = newref->prev;
	}
      }
      /* NEWREF inhibits CSE for HREF, and dependent FLOADs from HREFK/AREF.
      ** But the above search for conflicting stores was limited by xref.
      ** So continue searching, limited by the TNEW/TDUP. Store forwarding
      ** is ok, too. A conflict does NOT limit the search for a matching load.
      */
      while (ref > tab) {
	IRIns *store = IR(ref);
	switch (aa_ahref(J, xr, IR(store->op1))) {
	case ALIAS_NO:   break;  /* Continue searching. */
	case ALIAS_MAY:  goto cselim;  /* Conflicting store. */
	case ALIAS_MUST: return store->op2;  /* Store forwarding. */
	}
	ref = store->prev;
      }
      lua_assert(ir->o != IR_TNEW || irt_isnil(fins->t));
      if (irt_ispri(fins->t)) {
	return TREF_PRI(irt_type(fins->t));
      } else if (irt_isnum(fins->t) || (LJ_DUALNUM && irt_isint(fins->t)) ||
		 irt_isstr(fins->t)) {
	TValue keyv;
	cTValue *tv;
	IRIns *key = IR(xr->op2);
	if (key->o == IR_KSLOT) key = IR(key->op1);
	lj_ir_kvalue(J->L, &keyv, key);
	tv = lj_tab_get(J->L, ir_ktab(IR(ir->op1)), &keyv);
	lua_assert(itype2irt(tv) == irt_type(fins->t));
	if (irt_isnum(fins->t))
	  return lj_ir_knum_u64(J, tv->u64);
	else if (LJ_DUALNUM && irt_isint(fins->t))
	  return lj_ir_kint(J, intV(tv));
	else
	  return lj_ir_kstr(J, strV(tv));
      }
      /* Othwerwise: don't intern as a constant. */
    }
  }

cselim:
  /* Try to find a matching load. Below the conflicting store, if any. */
  ref = J->chain[fins->o];
  while (ref > lim) {
    IRIns *load = IR(ref);
    if (load->op1 == xref)
      return ref;  /* Load forwarding. */
    ref = load->prev;
  }
  return 0;  /* Conflict or no match. */
}